

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_parseInt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *pc;
  JSValue JVar2;
  int radix;
  int local_2c;
  int *local_28;
  
  pc = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (pc == (char *)0x0) {
    JVar2 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    local_28 = (int *)argv[1].u.ptr;
    JVar2 = argv[1];
    if (0xfffffff4 < (uint)argv[1].tag) {
      *local_28 = *local_28 + 1;
    }
    iVar1 = JS_ToInt32Free(ctx,&local_2c,JVar2);
    if (iVar1 == 0) {
      if (local_2c == 0 || 0xffffffdc < local_2c - 0x25U) {
        iVar1 = skip_spaces(pc);
        JVar2 = js_atof(ctx,pc + iVar1,(char **)0x0,local_2c,0x401);
      }
      else {
        JVar2.tag = 7;
        JVar2.u.float64 = NAN;
      }
    }
    else {
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JS_FreeCString(ctx,pc);
  }
  return JVar2;
}

Assistant:

static JSValue js_parseInt(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *str, *p;
    int radix, flags;
    JSValue ret;

    str = JS_ToCString(ctx, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &radix, argv[1])) {
        JS_FreeCString(ctx, str);
        return JS_EXCEPTION;
    }
    if (radix != 0 && (radix < 2 || radix > 36)) {
        ret = JS_NAN;
    } else {
        p = str;
        p += skip_spaces(p);
        flags = ATOD_INT_ONLY | ATOD_ACCEPT_PREFIX_AFTER_SIGN;
        ret = js_atof(ctx, p, NULL, radix, flags);
    }
    JS_FreeCString(ctx, str);
    return ret;
}